

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

double units::generateLeadingNumber(string *ustring,size_t *index)

{
  byte bVar1;
  pointer pcVar2;
  double dVar3;
  bool bVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  size_t oindex;
  size_t local_68;
  double local_60;
  double local_58;
  string local_50;
  
  *index = 0;
  dVar9 = getNumberBlock(ustring,index);
  if (NAN(dVar9)) {
LAB_001676f3:
    *index = 0;
  }
  else {
    uVar8 = *index;
    if (uVar8 < ustring->_M_string_length) {
      do {
        pcVar2 = (ustring->_M_dataplus)._M_p;
        bVar1 = pcVar2[uVar8];
        uVar5 = (ulong)bVar1;
        dVar3 = dVar9;
        if (uVar5 < 0x30) {
          if ((0x840000000000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_0016761f;
          if (uVar5 != 0x28) {
            if ((0x680000000000U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_00167616;
            dVar9 = NAN;
            goto LAB_001676f3;
          }
          local_68 = 0;
          std::__cxx11::string::substr((ulong)&local_50,(ulong)ustring);
          dVar10 = getNumberBlock(&local_50,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            local_60 = dVar10;
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            dVar10 = local_60;
          }
          if (!NAN(dVar10)) {
            dVar9 = dVar9 * dVar10;
            sVar6 = local_68;
            sVar7 = *index;
            goto LAB_001676b5;
          }
        }
        else {
LAB_00167616:
          if (bVar1 != 0x78) {
            return dVar9;
          }
LAB_0016761f:
          bVar4 = looksLikeNumber(ustring,uVar8 + 1);
          if ((!bVar4) && (pcVar2[uVar8 + 1] != '(')) {
            return dVar9;
          }
          local_68 = 0;
          std::__cxx11::string::substr((ulong)&local_50,(ulong)ustring);
          dVar10 = getNumberBlock(&local_50,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            local_60 = dVar10;
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            dVar10 = local_60;
          }
          if (!NAN(dVar10)) {
            sVar6 = *index;
            sVar7 = local_68;
            if ((ustring->_M_dataplus)._M_p[sVar6] == '/') {
              dVar9 = dVar9 / dVar10;
            }
            else {
              dVar9 = dVar9 * dVar10;
            }
LAB_001676b5:
            *index = sVar6 + sVar7 + 1;
            dVar3 = local_58;
          }
        }
        local_58 = dVar3;
        if (NAN(dVar10)) {
          return local_58;
        }
        uVar8 = *index;
        if (ustring->_M_string_length <= uVar8) {
          return dVar9;
        }
      } while( true );
    }
  }
  return dVar9;
}

Assistant:

double generateLeadingNumber(const std::string& ustring, size_t& index) noexcept
{
    index = 0;
    double val = getNumberBlock(ustring, index);
    if (std::isnan(val)) {
        index = 0;
        return val;
    }
    while (true) {
        if (index >= ustring.size()) {
            return val;
        }
        switch (ustring[index]) {
            case '.':
            case '-':
            case '+':
                index = 0;
                return constants::invalid_conversion;
            case '/':
            case '*':
            case 'x':
                if (looksLikeNumber(ustring, index + 1) ||
                    ustring[index + 1] == '(') {
                    size_t oindex{0};
                    double res =
                        getNumberBlock(ustring.substr(index + 1), oindex);
                    if (!std::isnan(res)) {
                        if (ustring[index] == '/') {
                            val /= res;
                        } else {
                            val *= res;
                        }

                        index = oindex + index + 1;
                    } else {
                        return val;
                    }
                } else {
                    return val;
                }
                break;
            case '(': {
                size_t oindex{0};
                double res = getNumberBlock(ustring.substr(index), oindex);
                if (!std::isnan(res)) {
                    val *= res;
                    index = oindex + index + 1;
                } else {
                    return val;
                }
                break;
            }
            default:
                return val;
        }
    }
}